

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ret1.cxx
# Opt level: O2

int main(int ac,char **av)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  char **ppcVar5;
  long lVar6;
  long lVar7;
  int i;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  char **ppcVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_16c;
  allocator<char> local_16b;
  allocator<char> local_16a;
  allocator<char> local_169;
  char **local_168;
  undefined8 local_160;
  string logfile;
  string logarg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  callargs;
  string exename;
  CommandLineArguments args;
  string arg;
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cmsys::Encoding::CommandLineArguments::Main(&args,ac,av);
  iVar4 = cmsys::Encoding::CommandLineArguments::argc(&args);
  ppcVar5 = cmsys::Encoding::CommandLineArguments::argv(&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&exename,*ppcVar5,(allocator<char> *)&arg);
  logarg._M_dataplus._M_p = (pointer)&logarg.field_2;
  logarg._M_string_length = 0;
  logarg.field_2._M_local_buf[0] = '\0';
  lVar6 = std::__cxx11::string::find((char *)&exename,0x229004);
  if ((lVar6 == -1) && (lVar6 = std::__cxx11::string::find((char *)&exename,0x229019), lVar6 == -1))
  {
    lVar6 = std::__cxx11::string::find((char *)&exename,0x229020);
    if (lVar6 != -1) {
      std::__cxx11::string::assign((char *)&logarg);
      bVar3 = 1;
      bVar2 = 0;
      goto LAB_0010ffc7;
    }
    lVar6 = std::__cxx11::string::find((char *)&exename,0x229026);
    if (lVar6 != -1) {
      bVar2 = 1;
      std::__cxx11::string::assign((char *)&logarg);
      bVar3 = 1;
      goto LAB_0010ffc7;
    }
  }
  else {
    std::__cxx11::string::assign((char *)&logarg);
  }
  bVar2 = 0;
  bVar3 = 0;
LAB_0010ffc7:
  if (logarg._M_string_length == 0) {
LAB_00110250:
    iVar4 = 1;
  }
  else {
    logfile._M_dataplus._M_p = (pointer)&logfile.field_2;
    logfile._M_string_length = 0;
    logfile.field_2._M_local_buf[0] = '\0';
    local_168 = (char **)(ulong)(iVar4 - 1);
    lVar6 = (long)iVar4;
    local_160 = 0;
    ppcVar11 = (char **)0x1;
    do {
      if (lVar6 <= (long)ppcVar11) {
        uVar10 = 1;
        local_168 = ppcVar5;
        for (uVar8 = 1; (long)uVar8 < lVar6; uVar8 = uVar8 + 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&arg,local_168[uVar8],(allocator<char> *)&callargs);
          lVar7 = std::__cxx11::string::find((char *)&arg,0x22903f);
          if (lVar7 == 0) {
            uVar10 = uVar8;
          }
          uVar10 = uVar10 & 0xffffffff;
          std::__cxx11::string::~string((string *)&arg);
        }
        if (logfile._M_string_length != 0) {
          cmsys::SystemTools::Touch(&logfile,true);
          iVar9 = (uint)bVar3 + (int)uVar10 + 1;
          if ((bool)(bVar2 & iVar9 < iVar4)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&arg,"/usr/bin/cmake",&local_169);
            std::__cxx11::string::string<std::allocator<char>>(local_90,"-E",&local_16a);
            std::__cxx11::string::string<std::allocator<char>>(local_70,"env",&local_16b);
            std::operator+(&local_50,"PSEUDO_LOGFILE=",&logfile);
            __l._M_len = 4;
            __l._M_array = &arg;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&callargs,__l,&local_16c);
            lVar7 = 0x60;
            do {
              std::__cxx11::string::~string(local_90 + lVar7 + -0x20);
              lVar7 = lVar7 + -0x20;
            } while (lVar7 != -0x20);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            insert<char_const*const*,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &callargs,
                       (const_iterator)
                       callargs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_168 + iVar9,
                       local_168 + lVar6);
            cmSystemTools::RunSingleCommand
                      (&callargs,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,
                       (cmDuration)0x0,Auto);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&callargs);
          }
        }
        std::__cxx11::string::~string((string *)&logfile);
        goto LAB_00110250;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arg,ppcVar5[(long)ppcVar11],(allocator<char> *)&callargs);
      lVar7 = std::__cxx11::string::find((string *)&arg,(ulong)&logarg);
      bVar1 = true;
      if (lVar7 == 0) {
        if (bVar3 == 0) {
          std::__cxx11::string::substr((ulong)&callargs,(ulong)&arg);
          std::__cxx11::string::operator=((string *)&logfile,(string *)&callargs);
          std::__cxx11::string::~string((string *)&callargs);
        }
        else if (local_168 == ppcVar11) {
          bVar1 = false;
          local_160 = 1;
        }
        else {
          std::__cxx11::string::assign((char *)&logfile);
        }
      }
      std::__cxx11::string::~string((string *)&arg);
      ppcVar11 = (char **)((long)ppcVar11 + 1);
    } while (bVar1);
    std::__cxx11::string::~string((string *)&logfile);
    iVar4 = (int)local_160;
  }
  std::__cxx11::string::~string((string *)&logarg);
  std::__cxx11::string::~string((string *)&exename);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&args);
  return iVar4;
}

Assistant:

int main(int ac, char** av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  int argc = args.argc();
  const char* const* argv = args.argv();

  std::string exename = argv[0];
  std::string logarg;
  bool nextarg = false;
  // execute the part after the last argument?
  // the logfile path gets passed as environment variable PSEUDO_LOGFILE
  bool exec = false;

  if (exename.find("valgrind") != std::string::npos) {
    logarg = "--log-file=";
  } else if (exename.find("purify") != std::string::npos) {
#ifdef _WIN32
    logarg = "/SAVETEXTDATA=";
#else
    logarg = "-log-file=";
#endif
  } else if (exename.find("BC") != std::string::npos) {
    nextarg = true;
    logarg = "/X";
  } else if (exename.find("cuda-memcheck") != std::string::npos) {
    nextarg = true;
    exec = true;
    logarg = "--log-file";
  }

  if (!logarg.empty()) {
    std::string logfile;
    for (int i = 1; i < argc; i++) {
      std::string arg = argv[i];
      if (arg.find(logarg) == 0) {
        if (nextarg) {
          if (i == argc - 1) {
            return 1; // invalid command line
          }
          logfile = argv[i + 1];
        } else {
          logfile = arg.substr(logarg.length());
        }
        // keep searching, it may be overridden later to provoke an error
      }
    }

    // find the last argument position
    int lastarg_pos = 1;
    for (int i = 1; i < argc; ++i) {
      std::string arg = argv[i];
      if (arg.find("--") == 0) {
        lastarg_pos = i;
      }
    }

    if (!logfile.empty()) {
      cmSystemTools::Touch(logfile, true);
      // execute everything after the last argument with additional environment
      int callarg_pos = lastarg_pos + (nextarg ? 2 : 1);
      if (exec && callarg_pos < argc) {
        std::vector<std::string> callargs{ CMAKE_COMMAND, "-E", "env",
                                           "PSEUDO_LOGFILE=" + logfile };
        callargs.insert(callargs.end(), &argv[callarg_pos], &argv[argc]);
        cmSystemTools::RunSingleCommand(callargs);
      }
    }
  }

  return RETVAL;
}